

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclKernel.cpp
# Opt level: O0

void __thiscall xmrig::OclKernel::setArg(OclKernel *this,uint32_t index,size_t size,void *value)

{
  cl_int ret_00;
  char *pcVar1;
  char *pcVar2;
  String *this_00;
  char *pcVar3;
  runtime_error *this_01;
  undefined8 in_RDX;
  uint in_ESI;
  OclKernel *in_RDI;
  cl_int ret;
  void *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  cl_kernel in_stack_ffffffffffffffb0;
  
  ret_00 = OclLib::setKernelArg
                     (in_stack_ffffffffffffffb0,(cl_uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                      in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (ret_00 != 0) {
    pcVar1 = ocl_tag();
    pcVar2 = OclError::toString(ret_00);
    this_00 = name(in_RDI);
    pcVar3 = String::data(this_00);
    Log::print(ERR,
               "%s\x1b[0;31m error \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m when calling \x1b[0m\x1b[1;31mclSetKernelArg\x1b[0m\x1b[0;31m for kernel \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m argument \x1b[0m\x1b[1;31m%u\x1b[0m\x1b[0;31m size \x1b[0m\x1b[1;31m%zu\x1b[0m"
               ,pcVar1,pcVar2,pcVar3,(ulong)in_ESI,in_RDX);
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    pcVar1 = OclError::toString(ret_00);
    std::runtime_error::runtime_error(this_01,pcVar1);
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void xmrig::OclKernel::setArg(uint32_t index, size_t size, const void *value)
{
    const cl_int ret = OclLib::setKernelArg(m_kernel, index, size, value);
    if (ret != CL_SUCCESS) {
        LOG_ERR("%s" RED(" error ") RED_BOLD("%s") RED(" when calling ") RED_BOLD("clSetKernelArg") RED(" for kernel ") RED_BOLD("%s")
                RED(" argument ") RED_BOLD("%u") RED(" size ") RED_BOLD("%zu"),
                ocl_tag(), OclError::toString(ret), name().data(), index, size);

        throw std::runtime_error(OclError::toString(ret));
    }
}